

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyManager.cpp
# Opt level: O3

void __thiscall KeyManager::Display(KeyManager *this)

{
  Node *this_00;
  Node **ppNVar1;
  
  ppNVar1 = this->uri_id;
  if (ppNVar1 != (Node **)0x0) {
    this_00 = *ppNVar1;
    while (this_00 != (Node *)0x0) {
      ppNVar1 = ppNVar1 + 1;
      Node::Display(this_00);
      this_00 = *ppNVar1;
    }
  }
  return;
}

Assistant:

void KeyManager::Display() {

	class Node **uri_id_list;
	if (uri_id != NULL) {
		uri_id_list = uri_id;
		while (*uri_id_list != NULL) {
			(*uri_id_list)->Display();
			uri_id_list++;
		}
	}

//	set<class IdUri *>::iterator it;
//	map<KEY_ID, class Node * >::iterator it;
//	for (unsigned int i = 0; i < types.size(); i++) {
//		cerr << endl << endl << "------------------------------> Type ID: " << i << ", nubmer of elements: "
//				<< types[i].elements.size() << endl ;
//		for (it = types[i].elements.begin(); it != types[i].elements.end();
//				it++) {
//			cout << (*it)->uri->uri << "\t( "  << (*it)->id << " ) " <<  "\t( "  << GetSeq((*it)->id) << " ) " << endl;
//		}
//	}




//	class IdUri **id_uri_list;
//	if (id_uri != NULL) {
//		id_uri_list = id_uri;
//		while (*id_uri_list != NULL) {
//			(*id_uri_list)->Display();
//			id_uri_list++;
//		}
//	}
}